

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

bool __thiscall trun::Process_Unix::IsFinished(Process_Unix *this)

{
  __pid_t _Var1;
  ILogger *pIVar2;
  allocator<char> local_2d;
  int status;
  string local_28;
  
  _Var1 = waitpid(this->pid,&status,3);
  if (_Var1 != 0) {
    if (_Var1 != -1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_28,"Process_Unix",&local_2d);
      pIVar2 = gnilk::Logger::GetLogger(&local_28);
      gnilk::Log::Debug<char_const*>(pIVar2,"Process exit");
      std::__cxx11::string::~string((string *)&local_28);
      if (((byte)status & 0x7f) == 0) {
        this->exitStatus = kNormal;
      }
      else {
        this->exitStatus = kAbnormal;
      }
      return true;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"Process_Unix",&local_2d)
    ;
    pIVar2 = gnilk::Logger::GetLogger(&local_28);
    gnilk::Log::Error<char_const*>(pIVar2,"Process error");
    std::__cxx11::string::~string((string *)&local_28);
  }
  return false;
}

Assistant:

bool Process_Unix::IsFinished() {
	int status;
	pid_t result = waitpid(pid, &status, WNOHANG | WUNTRACED);
	if (result == 0) {
	  // Child still alive
	} else if (result == -1) {
	  // Error 
        gnilk::Logger::GetLogger("Process_Unix")->Error("Process error");
	} else {
	    // Child exited
        gnilk::Logger::GetLogger("Process_Unix")->Debug("Process exit");
        if (WIFEXITED(status)) {
            exitStatus = ProcessExitStatus::kNormal;
        } else {
            exitStatus = ProcessExitStatus::kAbnormal;
        }
        //int exitCode = WEXITSTATUS(status);
		return true;
	}		
	return false;
}